

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O3

void UpdateMeshReferences
               (aiNode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *meshMapping)

{
  uint uVar1;
  uint a;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = node->mNumMeshes;
  if (uVar3 != 0) {
    uVar2 = 0;
    uVar5 = 0;
    do {
      uVar1 = (meshMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start[node->mMeshes[uVar2]];
      uVar4 = uVar5;
      if (uVar1 != 0xffffffff) {
        uVar4 = (ulong)((int)uVar5 + 1);
        node->mMeshes[uVar5] = uVar1;
        uVar3 = node->mNumMeshes;
      }
      uVar2 = uVar2 + 1;
      uVar5 = uVar4;
    } while (uVar2 < uVar3);
    node->mNumMeshes = (uint)uVar4;
    if ((uint)uVar4 == 0) {
      if (node->mMeshes != (uint *)0x0) {
        operator_delete__(node->mMeshes);
      }
      node->mMeshes = (uint *)0x0;
    }
  }
  if (node->mNumChildren != 0) {
    uVar5 = 0;
    do {
      UpdateMeshReferences(node->mChildren[uVar5],meshMapping);
      uVar5 = uVar5 + 1;
    } while (uVar5 < node->mNumChildren);
  }
  return;
}

Assistant:

void UpdateMeshReferences(aiNode* node, const std::vector<unsigned int>& meshMapping) {
    if (node->mNumMeshes)   {
        unsigned int out = 0;
        for (unsigned int a = 0; a < node->mNumMeshes;++a)  {

            unsigned int ref = node->mMeshes[a];
            if (UINT_MAX != (ref = meshMapping[ref]))   {
                node->mMeshes[out++] = ref;
            }
        }
        // just let the members that are unused, that's much cheaper
        // than a full array realloc'n'copy party ...
        if(!(node->mNumMeshes = out))   {

            delete[] node->mMeshes;
            node->mMeshes = NULL;
        }
    }
    // recursively update all children
    for (unsigned int i = 0; i < node->mNumChildren;++i) {
        UpdateMeshReferences(node->mChildren[i],meshMapping);
    }
}